

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

bool __thiscall kj::String::startsWith(String *this,StringPtr *other)

{
  int iVar1;
  char *pcVar2;
  char *__s1;
  char *pcVar3;
  bool bVar4;
  
  pcVar2 = (char *)(this->content).size_;
  __s1 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    __s1 = (this->content).ptr;
  }
  bVar4 = false;
  pcVar3 = (char *)0x0;
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2 + -1;
  }
  pcVar2 = (char *)((other->content).size_ - 1);
  if (pcVar2 <= pcVar3) {
    if (pcVar2 == (char *)0x0) {
      return true;
    }
    iVar1 = bcmp(__s1,(other->content).ptr,(size_t)pcVar2);
    bVar4 = iVar1 == 0;
  }
  return bVar4;
}

Assistant:

inline constexpr bool startsWith(const StringPtr& other) const { return asArray().startsWith(other);}